

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O0

double __thiscall
EncoderVelocity::GetEncoderAcceleration(EncoderVelocity *this,double percent_threshold)

{
  double velProd;
  double qtrSum;
  double qtrDiff;
  double acc;
  uint32_t velPeriodPrev;
  double percent_threshold_local;
  EncoderVelocity *this_local;
  
  if ((this->velOverflow & 1U) == 0) {
    acc._4_4_ = (this->velPeriod - this->qtr1Period) + this->qtr5Period;
    if ((this->qtr5Overflow & 1U) != 0) {
      acc._4_4_ = this->velPeriodMax;
    }
    if ((((this->qtr1Period == 0) || (this->qtr5Period == 0)) || (this->velPeriod == 0)) ||
       (acc._4_4_ == 0)) {
      this_local = (EncoderVelocity *)0x0;
    }
    else if (this->qtr1Edges == this->qtr5Edges) {
      if (((this->qtr1Dir & 1U) == (this->qtr5Dir & 1U)) &&
         ((this->qtr1Dir & 1U) == (this->velDir & 1U))) {
        qtrDiff = 0.0;
        if ((1.0 / (double)this->qtr1Period <= percent_threshold) &&
           (qtrDiff = (((double)this->qtr5Period - (double)this->qtr1Period) * 8.0) /
                      ((double)this->velPeriod * (double)acc._4_4_ * this->clkPeriod *
                       this->clkPeriod * (double)(this->qtr5Period + this->qtr1Period)),
           (this->velDir & 1U) == 0)) {
          qtrDiff = -qtrDiff;
        }
        this_local = (EncoderVelocity *)qtrDiff;
      }
      else {
        this_local = (EncoderVelocity *)0x0;
      }
    }
    else {
      this_local = (EncoderVelocity *)0x0;
    }
  }
  else {
    this_local = (EncoderVelocity *)0x0;
  }
  return (double)this_local;
}

Assistant:

double EncoderVelocity::GetEncoderAcceleration(double percent_threshold) const
{
    if (velOverflow)
        return 0.0;

    uint32_t velPeriodPrev = velPeriod - qtr1Period + qtr5Period;     // Previous full-cycle period
    if (qtr5Overflow)
        velPeriodPrev = velPeriodMax;

    // Should never happen
    if ((qtr1Period == 0) || (qtr5Period == 0) || (velPeriod == 0) || (velPeriodPrev == 0))
        return 0.0;

    if (qtr1Edges != qtr5Edges)
        return 0.0;

    if ((qtr1Dir != qtr5Dir) || (qtr1Dir != velDir))
        return 0.0;

    double acc = 0.0;
    if (1.0/qtr1Period <= percent_threshold) {
        double qtrDiff = static_cast<double>(qtr5Period) - static_cast<double>(qtr1Period);
        double qtrSum = static_cast<double>(qtr5Period + qtr1Period);
        double velProd = static_cast<double>(velPeriod)*static_cast<double>(velPeriodPrev)*clkPeriod*clkPeriod;
        acc = (8.0*qtrDiff)/(velProd*qtrSum);
        if (!velDir)
            acc = -acc;
    }
    return acc;
}